

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_metric.hpp
# Opt level: O3

void __thiscall
ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x00'>::clean_expired_label
          (dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_> *this)

{
  atomic<long> *paVar1;
  pointer pmVar2;
  size_t sVar3;
  map_lock_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type>_>_>_>
  *map;
  pointer this_00;
  time_point local_28;
  
  local_28.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  pmVar2 = (this->map_).shards_.
           super__Vector_base<ylt::util::internal::map_lock_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type>_>_>_>,_std::allocator<ylt::util::internal::map_lock_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->map_).shards_.
                 super__Vector_base<ylt::util::internal::map_lock_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type>_>_>_>,_std::allocator<ylt::util::internal::map_lock_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pmVar2; this_00 = this_00 + 1
      ) {
    sVar3 = util::internal::
            map_lock_t<std::unordered_map<std::span<std::__cxx11::string_const,0ul>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::value_type,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::my_hash<131ul>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::my_equal,std::allocator<std::pair<std::span<std::__cxx11::string_const,0ul>const,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::value_type>>>>
            ::
            erase_if<ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::clean_expired_label()::_lambda(auto:1&)_1_&>
                      ((map_lock_t<std::unordered_map<std::span<std::__cxx11::string_const,0ul>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::value_type,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::my_hash<131ul>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::my_equal,std::allocator<std::pair<std::span<std::__cxx11::string_const,0ul>const,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::value_type>>>>
                        *)this_00,(anon_class_8_1_ba1d6636 *)&local_28);
    LOCK();
    paVar1 = &(this->map_).size_;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i - sVar3;
    UNLOCK();
  }
  return;
}

Assistant:

void clean_expired_label() override {
    erase_if([now = std::chrono::steady_clock::now()](auto& pair) mutable {
      bool r = std::chrono::duration_cast<std::chrono::seconds>(
                   now - pair.second->get_created_time())
                   .count() >= ylt_label_max_age.count();
      return r;
    });
  }